

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O1

void uhash_setResizePolicy_63(UHashtable *hash,UHashResizePolicy policy)

{
  float fVar1;
  float fVar2;
  uint in_EAX;
  UErrorCode status;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  fVar1 = RESIZE_POLICY_RATIO_TABLE[(int)(policy * 2)];
  hash->lowWaterRatio = fVar1;
  fVar2 = RESIZE_POLICY_RATIO_TABLE[(int)(policy * 2 + 1)];
  hash->highWaterRatio = fVar2;
  hash->lowWaterMark = (int)(fVar1 * (float)hash->length);
  hash->highWaterMark = (int)(fVar2 * (float)hash->length);
  _uhash_rehash(hash,(UErrorCode *)((long)&uStack_8 + 4));
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_setResizePolicy(UHashtable *hash, enum UHashResizePolicy policy) {
    UErrorCode status = U_ZERO_ERROR;
    _uhash_internalSetResizePolicy(hash, policy);
    hash->lowWaterMark  = (int32_t)(hash->length * hash->lowWaterRatio);
    hash->highWaterMark = (int32_t)(hash->length * hash->highWaterRatio);
    _uhash_rehash(hash, &status);
}